

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void address_space_dispatch_free_mipsel(AddressSpaceDispatch *d)

{
  MemoryRegionSection *mem;
  MemoryRegion *mem_00;
  uint uVar1;
  
  while( true ) {
    uVar1 = (d->map).sections_nb;
    mem = (d->map).sections;
    if (uVar1 == 0) break;
    uVar1 = uVar1 - 1;
    (d->map).sections_nb = uVar1;
    mem_00 = mem[uVar1].mr;
    if (mem_00->subpage == true) {
      g_free(mem_00);
    }
  }
  g_free(mem);
  g_free((d->map).nodes);
  g_free(d);
  return;
}

Assistant:

void address_space_dispatch_free(AddressSpaceDispatch *d)
{
    phys_sections_free(&d->map);
    g_free(d);
}